

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
jwt::claim::as_set_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,claim *this)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  array *paVar3;
  undefined8 *puVar4;
  pointer pvVar5;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar3 = as_array(this);
  pvVar5 = (paVar3->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar2 = (paVar3->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pvVar5 == pvVar2) {
      return __return_storage_ptr__;
    }
    if (pvVar5->type_ != 3) break;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,(pvVar5->u_).string_);
    pvVar5 = pvVar5 + 1;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = PEM_read_bio_PrivateKey;
  __cxa_throw(puVar4,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

const std::set<std::string> as_set() const {
			std::set<std::string> res;
			for(auto& e : as_array()) {
				if(!e.is<std::string>())
					throw std::bad_cast();
				res.insert(e.get<std::string>());
			}
			return res;
		}